

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

Result * CoreML::Model::load(Result *__return_storage_ptr__,istream *in,Model *out)

{
  element_type *this;
  bool bVar1;
  IstreamInputStream *this_00;
  allocator local_e1;
  string local_e0;
  IstreamInputStream rawInput;
  CodedInputStream codedInput;
  
  if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) == 0) {
    this = (out->m_spec).
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    google::protobuf::io::IstreamInputStream::IstreamInputStream(&rawInput,in,-1);
    google::protobuf::io::CodedInputStream::CodedInputStream
              (&codedInput,&rawInput.super_ZeroCopyInputStream);
    google::protobuf::io::CodedInputStream::SetTotalBytesLimit(&codedInput,0x7fffffff,-1);
    bVar1 = google::protobuf::MessageLite::ParseFromCodedStream
                      (&this->super_MessageLite,&codedInput);
    if (bVar1) {
      Result::Result(__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::string((string *)&local_e0,"unable to deserialize object",&local_e1);
      Result::Result(__return_storage_ptr__,FAILED_TO_DESERIALIZE,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    google::protobuf::io::CodedInputStream::~CodedInputStream(&codedInput);
    google::protobuf::io::IstreamInputStream::~IstreamInputStream(&rawInput);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    validate((Result *)&rawInput,out);
    Result::operator=(__return_storage_ptr__,(Result *)&rawInput);
    this_00 = (IstreamInputStream *)&rawInput.copying_input_;
  }
  else {
    std::__cxx11::string::string
              ((string *)&rawInput,"unable to open file for read",(allocator *)&codedInput);
    Result::Result(__return_storage_ptr__,UNABLE_TO_OPEN_FILE,(string *)&rawInput);
    this_00 = &rawInput;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Result Model::load(std::istream& in, Model& out) {
        if (!in.good()) {
            return Result(ResultType::UNABLE_TO_OPEN_FILE,
                          "unable to open file for read");
        }

        
        Result r = loadSpecification(*(out.m_spec), in);
        if (!r.good()) { return r; }
        // validate on load
        
        r = out.validate();

        return r;
    }